

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O2

void nsvg__parseStyle(NSVGparser *p,char *str)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char c;
  char *__src;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char local_438 [512];
  char name [512];
  
  while (c = *str, c != '\0') {
    while ((c != '\0' && (iVar2 = nsvg__isspace(c), iVar2 != 0))) {
      c = str[1];
      str = str + 1;
    }
    iVar2 = -1;
    pcVar7 = str;
    while ((pcVar8 = pcVar7, c != ';' && (c != '\0'))) {
      pcVar8 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
      iVar2 = iVar2 + -1;
      c = *pcVar8;
    }
    while ((str < pcVar8 && ((*pcVar8 == ';' || (iVar3 = nsvg__isspace(*pcVar8), iVar3 != 0))))) {
      iVar2 = iVar2 + 1;
      pcVar8 = pcVar8 + -1;
    }
    iVar3 = -1;
    for (__src = str; (pcVar6 = __src, __src < pcVar8 + 1 && (*__src != ':')); __src = __src + 1) {
      iVar3 = iVar3 + -1;
      iVar2 = iVar2 + 1;
    }
    while ((str < pcVar6 && ((*pcVar6 == ':' || (iVar4 = nsvg__isspace(*pcVar6), iVar4 != 0))))) {
      iVar3 = iVar3 + 1;
      pcVar6 = pcVar6 + -1;
    }
    uVar5 = (ulong)(uint)-iVar3;
    if (0x1fe < -iVar3) {
      uVar5 = 0x1ff;
    }
    if (iVar3 != 0) {
      uVar5 = (ulong)(int)uVar5;
      memcpy(name,str,uVar5);
    }
    name[uVar5] = '\0';
    while ((__src < pcVar8 + 1 && ((*__src == ':' || (iVar3 = nsvg__isspace(*__src), iVar3 != 0)))))
    {
      __src = __src + 1;
      iVar2 = iVar2 + 1;
    }
    uVar1 = -iVar2;
    if (0x1fe < -iVar2) {
      uVar1 = 0x1ff;
    }
    uVar5 = (ulong)uVar1;
    if (iVar2 != 0) {
      uVar5 = (ulong)(int)uVar1;
      memcpy(local_438,__src,uVar5);
    }
    local_438[uVar5] = '\0';
    nsvg__parseAttr(p,name,local_438);
    str = pcVar7 + (*pcVar7 != '\0');
  }
  return;
}

Assistant:

static void nsvg__parseStyle(NSVGparser* p, const char* str)
{
	const char* start;
	const char* end;

	while (*str) {
		// Left Trim
		while(*str && nsvg__isspace(*str)) ++str;
		start = str;
		while(*str && *str != ';') ++str;
		end = str;

		// Right Trim
		while (end > start &&  (*end == ';' || nsvg__isspace(*end))) --end;
		++end;

		nsvg__parseNameValue(p, start, end);
		if (*str) ++str;
	}
}